

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O3

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  _Rb_tree_node_base *__rhs;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmCPackLog *pcVar5;
  cmCPackInstallationType *pcVar6;
  byte bVar7;
  cmCPackGenerator *pcVar8;
  _Alloc_hider msg;
  bool bVar9;
  bool bVar10;
  char *pcVar11;
  long lVar12;
  ostream *poVar13;
  size_t sVar14;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  long *plVar17;
  undefined8 *puVar18;
  ulong *puVar19;
  size_type *psVar20;
  ulong *puVar21;
  size_type sVar22;
  int iVar23;
  ulong uVar24;
  undefined8 uVar25;
  pointer ppcVar26;
  byte bVar27;
  cmCPackNSISGenerator *pcVar28;
  pointer pbVar29;
  pointer pbVar30;
  string nsisInstallOptions;
  string tmpFile;
  string nsisCmd;
  string componentDescriptions;
  string output;
  string componentName;
  ostringstream cmCPackLog_msg;
  string nsisFileName;
  int retVal;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  string defines;
  string installTypesCode;
  string nsisInFileName;
  string nsisInInstallOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  ostringstream dstr;
  ostringstream str;
  string local_960;
  cmCPackNSISGenerator *local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  long *local_918 [2];
  long local_908 [2];
  string local_8f8;
  string local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  _Rb_tree_node_base *local_898;
  string local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  string local_850;
  undefined1 local_830 [112];
  ios_base local_7c0 [264];
  undefined1 local_6b8 [112];
  ios_base local_648 [472];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 *local_430;
  long local_428;
  undefined1 local_420;
  undefined7 uStack_41f;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> local_410;
  char *local_3f8;
  undefined8 local_3f0;
  char local_3e8;
  undefined7 uStack_3e7;
  string local_3d8;
  string local_3b8;
  char *local_398;
  undefined8 local_390;
  char local_388;
  undefined7 uStack_387;
  long *local_378;
  long local_370;
  long local_368 [2];
  long *local_358;
  long local_350;
  long local_348 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])(&local_378,this,"NSIS.template.in");
  if (local_370 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6b8,"CPack error: Could not find NSIS installer template file.",0x39
              );
    std::ios::widen((char)(ostream *)local_6b8 + (char)*(ulong *)(local_6b8._0_8_ + -0x18));
    std::ostream::put((char)local_6b8);
    std::ostream::flush();
    pcVar5 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_1a8._0_8_;
    sVar14 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar5,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x2b,(char *)uVar25,sVar14);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    iVar23 = 0;
    goto LAB_0015cc12;
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
            (&local_358,this,"NSIS.InstallOptions.ini.in");
  if (local_350 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6b8,"CPack error: Could not find NSIS installer options file.",0x38)
    ;
    std::ios::widen((char)(ostream *)local_6b8 + (char)*(ulong *)(local_6b8._0_8_ + -0x18));
    std::ostream::put((char)local_6b8);
    std::ostream::flush();
    pcVar5 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_1a8._0_8_;
    sVar14 = strlen((char *)local_1a8._0_8_);
    cmCPackLog::Log(pcVar5,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x33,(char *)uVar25,sVar14);
    if ((_func_int **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    iVar23 = 0;
  }
  else {
    local_6b8._0_8_ = local_6b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_TOPLEVEL_DIRECTORY","");
    pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_6b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,pcVar11,(allocator<char> *)local_1a8);
    if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8f8,local_450._M_dataplus._M_p,
               local_450._M_dataplus._M_p + local_450._M_string_length);
    std::__cxx11::string::append((char *)&local_8f8);
    local_918[0] = local_908;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_918,local_450._M_dataplus._M_p,
               local_450._M_dataplus._M_p + local_450._M_string_length);
    std::__cxx11::string::append((char *)local_918);
    std::__cxx11::string::append((char *)&local_450);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar29 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar30 = (this->super_cmCPackGenerator).files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_940 = this;
    if (pbVar29 != pbVar30) {
      local_898 = (_Rb_tree_node_base *)&(this->super_cmCPackGenerator).toplevel;
      do {
        local_6b8._0_8_ = local_6b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"$INSTDIR","");
        cmSystemTools::RelativePath((string *)local_320,(string *)local_898,pbVar29);
        if ((local_940->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
            _M_node_count != 0) {
          lVar12 = std::__cxx11::string::find((char)(string *)local_320,0x2f);
          if (lVar12 == -1) {
            CustomComponentInstallDirectory((string *)local_830,local_940,(string *)local_320);
            std::__cxx11::string::operator=((string *)local_6b8,(string *)local_830);
          }
          else {
            std::__cxx11::string::substr((ulong)local_830,(ulong)local_320);
            CustomComponentInstallDirectory(&local_8d8,local_940,(string *)local_830);
            std::__cxx11::string::operator=((string *)local_6b8,(string *)&local_8d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
              operator_delete(local_8d8._M_dataplus._M_p,
                              CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                                       local_8d8.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
            operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
          }
          std::__cxx11::string::substr((ulong)local_830,(ulong)local_320);
          std::__cxx11::string::operator=((string *)local_320,(string *)local_830);
          if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
            operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
          }
        }
        if (local_320._8_8_ != 0) {
          sVar22 = 0;
          do {
            if (*(char *)(local_320._0_8_ + sVar22) == '/') {
              *(char *)(local_320._0_8_ + sVar22) = '\\';
            }
            sVar22 = sVar22 + 1;
          } while (local_320._8_8_ != sVar22);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  Delete \"",10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_6b8._0_8_,local_6b8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\\",1);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_320._0_8_,local_320._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
          operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
        }
        pbVar29 = pbVar29 + 1;
      } while (pbVar29 != pbVar30);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_6b8,"Uninstall Files: ",0x11);
    pcVar28 = local_940;
    std::__cxx11::stringbuf::str();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6b8,(char *)local_320._0_8_,local_320._8_8_);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar11 = local_320 + 0x10;
    if ((char *)local_320._0_8_ != pcVar11) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    pcVar5 = (pcVar28->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_320._0_8_;
    sVar14 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x53,(char *)uVar25,sVar14);
    if ((char *)local_320._0_8_ != pcVar11) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    local_6b8._0_8_ = local_6b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_NSIS_DELETE_FILES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar28->super_cmCPackGenerator,(string *)local_6b8,(char *)local_320._0_8_);
    if ((char *)local_320._0_8_ != pcVar11) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetListOfSubdirectories
              (pcVar28,(pcVar28->super_cmCPackGenerator).toplevel._M_dataplus._M_p,&local_338);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    pbVar29 = local_338.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_338.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar8 = &local_940->super_cmCPackGenerator;
      local_898 = (_Rb_tree_node_base *)&(local_940->super_cmCPackGenerator).Components;
      pbVar30 = local_338.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_6b8._0_8_ = local_6b8 + 0x10;
        local_6b8._8_8_ = 0;
        local_6b8._16_8_ = local_6b8._16_8_ & 0xffffffffffffff00;
        cmSystemTools::RelativePath((string *)local_830,&pcVar8->toplevel,pbVar30);
        if (local_830._8_8_ != 0) {
          if ((local_940->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
              _M_node_count == 0) {
LAB_0015a516:
            pcVar11 = (char *)local_830._0_8_;
            do {
              if (*pcVar11 == '/') {
                *pcVar11 = '\\';
              }
              pcVar11 = pcVar11 + 1;
            } while (pcVar11 != (char *)(local_830._0_8_ + local_830._8_8_));
          }
          else {
            lVar12 = std::__cxx11::string::find((char)(string *)local_830,0x2f);
            if (lVar12 != -1) {
              std::__cxx11::string::substr((ulong)&local_8d8,(ulong)local_830);
              std::__cxx11::string::operator=((string *)local_6b8,(string *)&local_8d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
                operator_delete(local_8d8._M_dataplus._M_p,
                                CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                                         local_8d8.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::string::substr((ulong)&local_8d8,(ulong)local_830);
              std::__cxx11::string::operator=((string *)local_830,(string *)&local_8d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
                operator_delete(local_8d8._M_dataplus._M_p,
                                CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                                         local_8d8.field_2._M_local_buf[0]) + 1);
              }
            }
            if (local_830._8_8_ != 0) goto LAB_0015a516;
          }
          CustomComponentInstallDirectory(&local_8d8,local_940,(string *)local_6b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  RMDir \"",9);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,local_8d8._M_dataplus._M_p,
                               local_8d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\\",1);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,(char *)local_830._0_8_,local_830._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          if (local_6b8._8_8_ != 0) {
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                                    *)local_898,(key_type *)local_6b8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pmVar15->Directories,(string *)local_830);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
            operator_delete(local_8d8._M_dataplus._M_p,
                            CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                                     local_8d8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
          operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
        }
        if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
          operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
        }
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar29);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"Uninstall Dirs: ",0x10)
    ;
    pcVar28 = local_940;
    std::__cxx11::stringbuf::str();
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6b8,(char *)local_830._0_8_,local_830._8_8_);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar11 = local_830 + 0x10;
    if ((char *)local_830._0_8_ != pcVar11) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    pcVar5 = (pcVar28->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_830._0_8_;
    sVar14 = strlen((char *)local_830._0_8_);
    cmCPackLog::Log(pcVar5,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x77,(char *)uVar25,sVar14);
    if ((char *)local_830._0_8_ != pcVar11) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    local_6b8._0_8_ = local_6b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_NSIS_DELETE_DIRECTORIES","");
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&pcVar28->super_cmCPackGenerator,(string *)local_6b8,(char *)local_830._0_8_);
    if ((char *)local_830._0_8_ != pcVar11) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"Configure file: ",0x10)
    ;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6b8,(char *)local_378,local_370);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,local_450._M_dataplus._M_p,local_450._M_string_length);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = (pcVar28->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_830._0_8_;
    sVar14 = strlen((char *)local_830._0_8_);
    cmCPackLog::Log(pcVar5,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,(char *)uVar25,sVar14);
    pcVar3 = local_6b8 + 0x10;
    if ((char *)local_830._0_8_ != pcVar11) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    local_6b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"CPACK_NSIS_MUI_ICON","");
    bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    bVar10 = true;
    if (!bVar9) {
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_MUI_UNIICON","");
      bVar10 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
    }
    if ((char *)local_6b8._0_8_ != pcVar3) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if (bVar10 != false) {
      local_6b8._8_8_ = 0;
      local_6b8._16_8_ = local_6b8._16_8_ & 0xffffffffffffff00;
      local_830._0_8_ = pcVar11;
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"CPACK_NSIS_MUI_ICON","");
      bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if (bVar9) {
        std::__cxx11::string::append(local_6b8);
        local_830._0_8_ = pcVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_830,"CPACK_NSIS_MUI_ICON","");
        cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
        std::__cxx11::string::append(local_6b8);
        if ((char *)local_830._0_8_ != pcVar11) {
          operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
        }
        std::__cxx11::string::append(local_6b8);
      }
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_MUI_UNIICON","");
      bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if (bVar9) {
        std::__cxx11::string::append(local_6b8);
        local_830._0_8_ = pcVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_830,"CPACK_NSIS_MUI_UNIICON","");
        cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
        std::__cxx11::string::append(local_6b8);
        if ((char *)local_830._0_8_ != pcVar11) {
          operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
        }
        std::__cxx11::string::append(local_6b8);
      }
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_830,(char *)local_6b8._0_8_);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
    }
    local_6b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"CPACK_PACKAGE_ICON","");
    bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    if ((char *)local_6b8._0_8_ != pcVar3) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if (bVar9) {
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"!define MUI_HEADERIMAGE_BITMAP \"","");
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"CPACK_PACKAGE_ICON","");
      cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      std::__cxx11::string::append(local_6b8);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      std::__cxx11::string::append(local_6b8);
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_INSTALLER_ICON_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_830,(char *)local_6b8._0_8_);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
    }
    local_6b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
    bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    if ((char *)local_6b8._0_8_ != pcVar3) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if (bVar9) {
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"!define MUI_WELCOMEFINISHPAGE_BITMAP \"","");
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP","");
      cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      std::__cxx11::string::append(local_6b8);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      std::__cxx11::string::append(local_6b8);
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_830,(char *)local_6b8._0_8_);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
    }
    local_6b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
    bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    if ((char *)local_6b8._0_8_ != pcVar3) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if (bVar9) {
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"","");
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP","");
      cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      std::__cxx11::string::append(local_6b8);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      std::__cxx11::string::append(local_6b8);
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_830,(char *)local_6b8._0_8_);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
    }
    local_6b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
    bVar9 = cmCPackGenerator::IsSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    if ((char *)local_6b8._0_8_ != pcVar3) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if (bVar9) {
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"!define MUI_FINISHPAGE_RUN \"$INSTDIR\\","");
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_EXECUTABLES_DIRECTORY","");
      cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      std::__cxx11::string::append(local_6b8);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      std::__cxx11::string::append(local_6b8);
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_MUI_FINISHPAGE_RUN","");
      cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_830);
      std::__cxx11::string::append(local_6b8);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      std::__cxx11::string::append(local_6b8);
      local_830._0_8_ = pcVar11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_830,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_830,(char *)local_6b8._0_8_);
      if ((char *)local_830._0_8_ != pcVar11) {
        operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
      }
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
    }
    if ((pcVar28->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
        _M_node_count == 0) {
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_INSTALLATION_TYPES","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_PAGE_COMPONENTS","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_FULL_INSTALL","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"File /r \"${INST_DIR}\\*.*\""
                );
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_COMPONENT_SECTIONS","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      if ((char *)local_6b8._0_8_ != pcVar3) {
        operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
      }
      local_6b8._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,"CPACK_NSIS_SECTION_SELECTED_VARS","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,(string *)local_6b8,"");
      uVar24 = local_6b8._16_8_;
      pcVar11 = (char *)local_6b8._0_8_;
      if ((char *)local_6b8._0_8_ != pcVar3) goto LAB_0015c5b7;
    }
    else {
      local_830._8_8_ = 0;
      local_830[0x10] = '\0';
      local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
      local_8d8._M_string_length = 0;
      local_8d8.field_2._M_local_buf[0] = '\0';
      local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
      local_850._M_string_length = 0;
      local_850.field_2._M_local_buf[0] = '\0';
      local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
      local_870._M_string_length = 0;
      local_870.field_2._M_local_buf[0] = '\0';
      local_430 = &local_420;
      local_428 = 0;
      local_420 = 0;
      local_398 = &local_388;
      local_390 = 0;
      local_388 = '\0';
      local_3f8 = &local_3e8;
      local_3f0 = 0;
      local_3e8 = '\0';
      local_830._0_8_ = pcVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
      std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                (&local_410,
                 (pcVar28->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                 super__Rb_tree_header._M_node_count,(allocator_type *)&local_960);
      for (p_Var16 = (pcVar28->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                     super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var16 !=
          &(pcVar28->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        local_410.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_start[p_Var16[4]._M_color - _S_black] =
             (cmCPackInstallationType *)(p_Var16 + 2);
      }
      if (local_410.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_410.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ppcVar26 = local_410.
                   super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar6 = *ppcVar26;
          std::__cxx11::string::append((char *)&local_398);
          std::__cxx11::string::_M_append
                    ((char *)&local_398,(ulong)(pcVar6->DisplayName)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_398);
          ppcVar26 = ppcVar26 + 1;
        } while (ppcVar26 !=
                 local_410.
                 super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      p_Var16 = (local_940->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(local_940->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var16 != p_Var1) {
        paVar2 = &local_960.field_2;
        paVar4 = &local_8b8.field_2;
        do {
          if (*(long *)(p_Var16 + 6) == 0) {
            CreateComponentGroupDescription_abi_cxx11_
                      (&local_960,local_940,(cmCPackComponentGroup *)(p_Var16 + 2),
                       (ostream *)local_6b8);
            std::__cxx11::string::_M_append(local_830,(ulong)local_960._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_960._M_dataplus._M_p != paVar2) {
              operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (p_Var16[4]._M_parent != (_Base_ptr)0x0) {
            std::operator+(&local_470,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var16 + 1));
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_470);
            puVar19 = (ulong *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_8b8.field_2._M_allocated_capacity = *puVar19;
              local_8b8.field_2._8_4_ = (undefined4)plVar17[3];
              local_8b8.field_2._12_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
              local_8b8._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_8b8.field_2._M_allocated_capacity = *puVar19;
              local_8b8._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_8b8._M_string_length = plVar17[1];
            *plVar17 = (long)puVar19;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3b8,*(long *)(p_Var16 + 4),
                       (long)&(p_Var16[4]._M_parent)->_M_color + *(long *)(p_Var16 + 4));
            TranslateNewlines(&local_890,&local_3b8);
            uVar25 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8b8._M_dataplus._M_p != paVar4) {
              uVar25 = local_8b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 < local_890._M_string_length + local_8b8._M_string_length) {
              uVar25 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_890._M_dataplus._M_p != &local_890.field_2) {
                uVar25 = local_890.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar25 < local_890._M_string_length + local_8b8._M_string_length)
              goto LAB_0015b604;
              puVar18 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_890,0,(char *)0x0,(ulong)local_8b8._M_dataplus._M_p
                                  );
            }
            else {
LAB_0015b604:
              puVar18 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_8b8,(ulong)local_890._M_dataplus._M_p);
            }
            psVar20 = puVar18 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar18 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_938.field_2._M_allocated_capacity = *psVar20;
              local_938.field_2._8_8_ = puVar18[3];
              local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
            }
            else {
              local_938.field_2._M_allocated_capacity = *psVar20;
              local_938._M_dataplus._M_p = (pointer)*puVar18;
            }
            local_938._M_string_length = puVar18[1];
            *puVar18 = psVar20;
            puVar18[1] = 0;
            *(undefined1 *)psVar20 = 0;
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_938);
            psVar20 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960.field_2._8_8_ = plVar17[3];
              local_960._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_960._M_string_length = plVar17[1];
            *plVar17 = (long)psVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_960._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_960._M_dataplus._M_p != paVar2) {
              operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_938._M_dataplus._M_p != &local_938.field_2) {
              operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_dataplus._M_p != &local_890.field_2) {
              operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8b8._M_dataplus._M_p != paVar4) {
              operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p != &local_470.field_2) {
              operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1
                             );
            }
          }
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var1);
      }
      p_Var16 = (local_940->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_898 = &(local_940->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header
                   ._M_header;
      if (p_Var16 == local_898) {
        bVar27 = 0;
      }
      else {
        paVar2 = &local_960.field_2;
        bVar27 = 0;
        do {
          if (p_Var16[9]._M_right != *(_Base_ptr *)(p_Var16 + 10)) {
            bVar7 = bVar27 & 1;
            bVar27 = *(byte *)&p_Var16[4]._M_parent >> 3;
            if (bVar7 != 0) {
              bVar27 = 1;
            }
            if (*(long *)(p_Var16 + 4) == 0) {
              CreateComponentDescription_abi_cxx11_
                        (&local_960,local_940,(cmCPackComponent *)(p_Var16 + 2),(ostream *)local_6b8
                        );
              std::__cxx11::string::_M_append(local_830,(ulong)local_960._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_960._M_dataplus._M_p != paVar2) {
                operator_delete(local_960._M_dataplus._M_p,
                                local_960.field_2._M_allocated_capacity + 1);
              }
            }
            std::__cxx11::string::append((char *)&local_8d8);
            std::__cxx11::string::_M_append((char *)&local_8d8,*(ulong *)(p_Var16 + 1));
            std::__cxx11::string::append((char *)&local_8d8);
            __rhs = p_Var16 + 1;
            std::operator+(&local_938,"Var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_938);
            psVar20 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960.field_2._8_8_ = plVar17[3];
              local_960._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_960._M_string_length = plVar17[1];
            *plVar17 = (long)psVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_850,(ulong)local_960._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_960._M_dataplus._M_p != paVar2) {
              operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_938._M_dataplus._M_p != &local_938.field_2) {
              operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1
                             );
            }
            std::operator+(&local_938,"Var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            plVar17 = (long *)std::__cxx11::string::append((char *)&local_938);
            psVar20 = (size_type *)(plVar17 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar20) {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960.field_2._8_8_ = plVar17[3];
              local_960._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_960.field_2._M_allocated_capacity = *psVar20;
              local_960._M_dataplus._M_p = (pointer)*plVar17;
            }
            local_960._M_string_length = plVar17[1];
            *plVar17 = (long)psVar20;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_850,(ulong)local_960._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_960._M_dataplus._M_p != paVar2) {
              operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_938._M_dataplus._M_p != &local_938.field_2) {
              operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1
                             );
            }
            if (p_Var16[4]._M_right != (_Base_ptr)0x0) {
              std::operator+(&local_470,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_470);
              local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
              puVar19 = (ulong *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar19) {
                local_8b8.field_2._M_allocated_capacity = *puVar19;
                local_8b8.field_2._8_4_ = (undefined4)plVar17[3];
                local_8b8.field_2._12_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
              }
              else {
                local_8b8.field_2._M_allocated_capacity = *puVar19;
                local_8b8._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_8b8._M_string_length = plVar17[1];
              *plVar17 = (long)puVar19;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d8,p_Var16[4]._M_left,
                         (long)&(p_Var16[4]._M_right)->_M_color + (long)p_Var16[4]._M_left);
              TranslateNewlines(&local_890,&local_3d8);
              uVar25 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
                uVar25 = local_8b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar25 < local_890._M_string_length + local_8b8._M_string_length) {
                uVar25 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_890._M_dataplus._M_p != &local_890.field_2) {
                  uVar25 = local_890.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar25 < local_890._M_string_length + local_8b8._M_string_length)
                goto LAB_0015bb1a;
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_890,0,(char *)0x0,
                                     (ulong)local_8b8._M_dataplus._M_p);
              }
              else {
LAB_0015bb1a:
                puVar18 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_8b8,(ulong)local_890._M_dataplus._M_p);
              }
              local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
              psVar20 = puVar18 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar20) {
                local_938.field_2._M_allocated_capacity = *psVar20;
                local_938.field_2._8_8_ = puVar18[3];
              }
              else {
                local_938.field_2._M_allocated_capacity = *psVar20;
                local_938._M_dataplus._M_p = (pointer)*puVar18;
              }
              local_938._M_string_length = puVar18[1];
              *puVar18 = psVar20;
              puVar18[1] = 0;
              *(undefined1 *)psVar20 = 0;
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_938);
              psVar20 = (size_type *)(plVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar17 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar20) {
                local_960.field_2._M_allocated_capacity = *psVar20;
                local_960.field_2._8_8_ = plVar17[3];
                local_960._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_960.field_2._M_allocated_capacity = *psVar20;
                local_960._M_dataplus._M_p = (pointer)*plVar17;
              }
              local_960._M_string_length = plVar17[1];
              *plVar17 = (long)psVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_960._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_960._M_dataplus._M_p != paVar2) {
                operator_delete(local_960._M_dataplus._M_p,
                                local_960.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_938._M_dataplus._M_p != &local_938.field_2) {
                operator_delete(local_938._M_dataplus._M_p,
                                local_938.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_890._M_dataplus._M_p != &local_890.field_2) {
                operator_delete(local_890._M_dataplus._M_p,
                                local_890.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p,
                                local_3d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
                operator_delete(local_8b8._M_dataplus._M_p,
                                local_8b8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_470._M_dataplus._M_p != &local_470.field_2) {
                operator_delete(local_470._M_dataplus._M_p,
                                local_470.field_2._M_allocated_capacity + 1);
              }
            }
          }
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != local_898);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append(local_830,(ulong)local_960._M_dataplus._M_p);
      paVar2 = &local_960.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      if (local_428 == 0 && local_870._M_string_length == 0) {
        local_960._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_960,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&local_940->super_cmCPackGenerator,&local_960,"!define MUI_COMPONENTSPAGE_NODESC"
                  );
      }
      else {
        std::operator+(&local_8b8,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",&local_870);
        puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b8,(ulong)local_430)
        ;
        psVar20 = puVar18 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_938.field_2._M_allocated_capacity = *psVar20;
          local_938.field_2._8_8_ = puVar18[3];
          local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
        }
        else {
          local_938.field_2._M_allocated_capacity = *psVar20;
          local_938._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_938._M_string_length = puVar18[1];
        *puVar18 = psVar20;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_938);
        psVar20 = (size_type *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar17 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_960.field_2._M_allocated_capacity = *psVar20;
          local_960.field_2._8_8_ = plVar17[3];
          local_960._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_960.field_2._M_allocated_capacity = *psVar20;
          local_960._M_dataplus._M_p = (pointer)*plVar17;
        }
        local_960._M_string_length = plVar17[1];
        *plVar17 = (long)psVar20;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_870,(string *)&local_960);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != paVar2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
          operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
        }
        local_960._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_960,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC","");
        cmCPackGenerator::SetOptionIfNotSet
                  (&local_940->super_cmCPackGenerator,&local_960,local_870._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      pcVar28 = local_940;
      if ((bVar27 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_3f8);
        local_960._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"CPACK_ADD_REMOVE","");
        pcVar11 = cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,&local_960);
        bVar9 = cmSystemTools::IsOn(pcVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_960._M_dataplus._M_p != paVar2) {
          operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
        }
        if (bVar9) {
          std::__cxx11::string::append((char *)&local_3f8);
        }
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_INSTALLATION_TYPES","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,&local_960,local_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_PAGE_COMPONENTS","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,&local_960,"!insertmacro MUI_PAGE_COMPONENTS");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_FULL_INSTALL","");
      cmCPackGenerator::SetOptionIfNotSet(&pcVar28->super_cmCPackGenerator,&local_960,"");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_COMPONENT_SECTIONS","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,&local_960,(char *)local_830._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_COMPONENT_SECTION_LIST","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,&local_960,local_8d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_960,"CPACK_NSIS_SECTION_SELECTED_VARS","");
      cmCPackGenerator::SetOptionIfNotSet
                (&pcVar28->super_cmCPackGenerator,&local_960,local_850._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      local_960._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"CPACK_NSIS_DEFINES","");
      cmCPackGenerator::SetOption(&pcVar28->super_cmCPackGenerator,&local_960,local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_dataplus._M_p != paVar2) {
        operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
      }
      if (local_410.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_410.
                        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_410.
                              super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_410.
                              super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
      std::ios_base::~ios_base(local_648);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
      }
      if (local_398 != &local_388) {
        operator_delete(local_398,CONCAT71(uStack_387,local_388) + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,CONCAT71(uStack_41f,local_420) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870._M_dataplus._M_p != &local_870.field_2) {
        operator_delete(local_870._M_dataplus._M_p,
                        CONCAT71(local_870.field_2._M_allocated_capacity._1_7_,
                                 local_870.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_850._M_dataplus._M_p != &local_850.field_2) {
        operator_delete(local_850._M_dataplus._M_p,
                        CONCAT71(local_850.field_2._M_allocated_capacity._1_7_,
                                 local_850.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
        operator_delete(local_8d8._M_dataplus._M_p,
                        CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                                 local_8d8.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
        uVar24 = CONCAT71(local_830._17_7_,local_830[0x10]);
        pcVar11 = (char *)local_830._0_8_;
LAB_0015c5b7:
        operator_delete(pcVar11,uVar24 + 1);
      }
    }
    puVar19 = (ulong *)(local_6b8 + 0x10);
    (*(pcVar28->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])(pcVar28,&local_358,local_918,0)
    ;
    (*(pcVar28->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])
              (pcVar28,&local_378,&local_450,0);
    local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"\"","");
    local_6b8._0_8_ = puVar19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_6b8,"CPACK_INSTALLER_PROGRAM","");
    cmCPackGenerator::GetOption(&pcVar28->super_cmCPackGenerator,(string *)local_6b8);
    std::__cxx11::string::append((char *)&local_8d8);
    if ((ulong *)local_6b8._0_8_ != puVar19) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830,
                   "\" \"",&local_450);
    plVar17 = (long *)std::__cxx11::string::append(local_830);
    puVar21 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar21) {
      local_6b8._16_8_ = *puVar21;
      local_6b8._24_8_ = plVar17[3];
      local_6b8._0_8_ = puVar19;
    }
    else {
      local_6b8._16_8_ = *puVar21;
      local_6b8._0_8_ = (ulong *)*plVar17;
    }
    local_6b8._8_8_ = plVar17[1];
    *plVar17 = (long)puVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_8d8,local_6b8._0_8_);
    if ((ulong *)local_6b8._0_8_ != puVar19) {
      operator_delete((void *)local_6b8._0_8_,local_6b8._16_8_ + 1);
    }
    if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"Execute: ",9);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_6b8,local_8d8._M_dataplus._M_p,local_8d8._M_string_length)
    ;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar5 = (pcVar28->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar25 = local_830._0_8_;
    sVar14 = strlen((char *)local_830._0_8_);
    cmCPackLog::Log(pcVar5,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,300,(char *)uVar25,sVar14);
    if ((undefined1 *)local_830._0_8_ != local_830 + 0x10) {
      operator_delete((void *)local_830._0_8_,CONCAT71(local_830._17_7_,local_830[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b8);
    std::ios_base::~ios_base(local_648);
    local_850._M_string_length = 0;
    local_850.field_2._M_local_buf[0] = '\0';
    local_430 = (undefined1 *)CONCAT44(local_430._4_4_,1);
    local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
    bVar9 = cmSystemTools::RunSingleCommand
                      (&local_8d8,&local_850,&local_850,(int *)&local_430,(char *)0x0,
                       (pcVar28->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0);
    iVar23 = 1;
    if (!bVar9 || (int)local_430 != 0) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_6b8,&local_8f8,false,None);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b8,"# Run command: ",0xf)
      ;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_6b8,local_8d8._M_dataplus._M_p,
                           local_8d8._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      poVar13 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"# Output:",9);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      poVar13 = (ostream *)std::ostream::flush();
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_850._M_dataplus._M_p,local_850._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_830);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_830,"Problem running NSIS command: ",0x1e);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_830,local_8d8._M_dataplus._M_p,
                           local_8d8._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      poVar13 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Please check ",0xd);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_8f8._M_dataplus._M_p,local_8f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," for errors",0xb);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar5 = (pcVar28->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg._M_p = local_870._M_dataplus._M_p;
      sVar14 = strlen(local_870._M_dataplus._M_p);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x13b,msg._M_p,sVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_870._M_dataplus._M_p != &local_870.field_2) {
        operator_delete(local_870._M_dataplus._M_p,
                        CONCAT71(local_870.field_2._M_allocated_capacity._1_7_,
                                 local_870.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_830);
      std::ios_base::~ios_base(local_7c0);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_6b8);
      iVar23 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_dataplus._M_p != &local_850.field_2) {
      operator_delete(local_850._M_dataplus._M_p,
                      CONCAT71(local_850.field_2._M_allocated_capacity._1_7_,
                               local_850.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                               local_8d8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_918[0] != local_908) {
      operator_delete(local_918[0],local_908[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
LAB_0015cc12:
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  return iVar23;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = nsisFileName;
  tmpFile += "/NSISOutput.log";
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        const std::string componentName = fileN.substr(0, pos);
        outputDir = CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str().c_str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN = fileN.substr(slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str().c_str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += "!define MUI_ICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_ICON");
      installerIconCode += "\"\n";
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode += "!define MUI_UNICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_UNIICON");
      installerIconCode += "\"\n";
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  if (this->IsSet("CPACK_PACKAGE_ICON")) {
    std::string installerIconCode = "!define MUI_HEADERIMAGE_BITMAP \"";
    installerIconCode += this->GetOption("CPACK_PACKAGE_ICON");
    installerIconCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode = "!define MUI_FINISHPAGE_RUN \"$INSTDIR\\";
    installerRunCode += this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY");
    installerRunCode += "\\";
    installerRunCode += this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN");
    installerRunCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode.c_str());
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions.c_str());
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (cmSystemTools::IsOn(this->GetOption("CPACK_ADD_REMOVE"))) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES",
                            installTypesCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS",
                            componentCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST",
                            sectionList.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList.c_str());
    this->SetOption("CPACK_NSIS_DEFINES", defines.c_str());
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd = "\"";
  nsisCmd += this->GetOption("CPACK_INSTALLER_PROGRAM");
  nsisCmd += "\" \"" + nsisFileName + "\"";
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}